

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

void evmap_delete_all_(event_base *base)

{
  long *plVar1;
  int iVar2;
  event *peVar3;
  long lVar4;
  
  iVar2 = (base->sigmap).nentries;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      plVar1 = (long *)(base->sigmap).entries[lVar4];
      if ((plVar1 != (long *)0x0) && (peVar3 = (event *)*plVar1, peVar3 != (event *)0x0)) {
        do {
          event_del(peVar3);
          peVar3 = (event *)*plVar1;
        } while (peVar3 != (event *)0x0);
        iVar2 = (base->sigmap).nentries;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  iVar2 = (base->io).nentries;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      plVar1 = (long *)(base->io).entries[lVar4];
      if ((plVar1 != (long *)0x0) && (peVar3 = (event *)*plVar1, peVar3 != (event *)0x0)) {
        do {
          event_del(peVar3);
          peVar3 = (event *)*plVar1;
        } while (peVar3 != (event *)0x0);
        iVar2 = (base->io).nentries;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void
evmap_delete_all_(struct event_base *base)
{
	evmap_signal_foreach_signal(base, evmap_signal_delete_all_iter_fn, NULL);
	evmap_io_foreach_fd(base, evmap_io_delete_all_iter_fn, NULL);
}